

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O0

int appenddata(char **dst_buf,size_t *dst_len,size_t *dst_alloc,char *src_buf,int src_b64)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  char *newptr;
  size_t newsize;
  size_t src_len;
  size_t need_alloc;
  int src_b64_local;
  char *src_buf_local;
  size_t *dst_alloc_local;
  size_t *dst_len_local;
  char **dst_buf_local;
  
  newsize = strlen(src_buf);
  if (newsize != 0) {
    uVar1 = newsize + *dst_len + 1;
    if (src_b64 != 0) {
      if (src_buf[newsize - 1] == '\r') {
        newsize = newsize - 1;
      }
      if (src_buf[newsize - 1] == '\n') {
        newsize = newsize - 1;
      }
    }
    if (*dst_alloc < uVar1) {
      sVar2 = uVar1 * 2;
      pcVar3 = (char *)(*Curl_crealloc)(*dst_buf,sVar2);
      if (pcVar3 == (char *)0x0) {
        return -1;
      }
      *dst_alloc = sVar2;
      *dst_buf = pcVar3;
    }
    memcpy(*dst_buf + *dst_len,src_buf,newsize);
    *dst_len = newsize + *dst_len;
    (*dst_buf)[*dst_len] = '\0';
  }
  return 0;
}

Assistant:

static int appenddata(char  **dst_buf,   /* dest buffer */
                      size_t *dst_len,   /* dest buffer data length */
                      size_t *dst_alloc, /* dest buffer allocated size */
                      char   *src_buf,   /* source buffer */
                      int     src_b64)   /* != 0 if source is base64 encoded */
{
  size_t need_alloc = 0;
  size_t src_len = strlen(src_buf);

  if(!src_len)
    return GPE_OK;

  need_alloc = src_len + *dst_len + 1;

  if(src_b64) {
    if(src_buf[src_len - 1] == '\r')
      src_len--;

    if(src_buf[src_len - 1] == '\n')
      src_len--;
  }

  /* enlarge destination buffer if required */
  if(need_alloc > *dst_alloc) {
    size_t newsize = need_alloc * 2;
    char *newptr = realloc(*dst_buf, newsize);
    if(!newptr) {
      return GPE_OUT_OF_MEMORY;
    }
    *dst_alloc = newsize;
    *dst_buf = newptr;
  }

  /* memcpy to support binary blobs */
  memcpy(*dst_buf + *dst_len, src_buf, src_len);
  *dst_len += src_len;
  *(*dst_buf + *dst_len) = '\0';

  return GPE_OK;
}